

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O2

ComputePipelineStateCreateInfoX * __thiscall
Diligent::
PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
::AddSignature(PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
               *this,IPipelineResourceSignature *pSignature)

{
  pointer ppIVar1;
  pointer ppIVar2;
  uint uVar3;
  char (*Args_1) [57];
  string msg;
  IPipelineResourceSignature *local_38;
  string local_30;
  
  local_38 = pSignature;
  if (pSignature == (IPipelineResourceSignature *)0x0) {
    FormatString<char[27]>(&local_30,(char (*) [27])"Signature must not be null");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"AddSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/interface/GraphicsTypesX.hpp"
               ,0x510);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    std::
    vector<Diligent::IPipelineResourceSignature*,std::allocator<Diligent::IPipelineResourceSignature*>>
    ::emplace_back<Diligent::IPipelineResourceSignature*&>
              ((vector<Diligent::IPipelineResourceSignature*,std::allocator<Diligent::IPipelineResourceSignature*>>
                *)&this->Signatures,&local_38);
    ppIVar1 = (this->Signatures).
              super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppIVar2 = (this->Signatures).
              super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.ppResourceSignatures
         = ppIVar1;
    Args_1 = (char (*) [57])((ulong)((long)ppIVar2 - (long)ppIVar1) >> 3);
    uVar3 = (uint)Args_1;
    (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.
    ResourceSignaturesCount = uVar3;
    if (8 < uVar3) {
      FormatString<char[26],char[57]>
                (&local_30,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"this->ResourceSignaturesCount <= MAX_RESOURCE_SIGNATURES",Args_1);
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"AddSignature",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/interface/GraphicsTypesX.hpp"
                 ,0x517);
      std::__cxx11::string::~string((string *)&local_30);
    }
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
    ::emplace_back<Diligent::IPipelineResourceSignature*&>
              ((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
                *)&this->Objects,&local_38);
  }
  return (ComputePipelineStateCreateInfoX *)this;
}

Assistant:

DerivedType& AddSignature(IPipelineResourceSignature* pSignature)
    {
        if (pSignature == nullptr)
        {
            UNEXPECTED("Signature must not be null");
            return static_cast<DerivedType&>(*this);
        }

        Signatures.emplace_back(pSignature);
        this->ppResourceSignatures    = Signatures.data();
        this->ResourceSignaturesCount = static_cast<Uint32>(Signatures.size());
        VERIFY_EXPR(this->ResourceSignaturesCount <= MAX_RESOURCE_SIGNATURES);
        Objects.emplace_back(pSignature);

        return static_cast<DerivedType&>(*this);
    }